

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL_mock::GLCompiledProgram::addUniqueTexture
          (GLCompiledProgram *this,ShaderSpecTexture *newTexture)

{
  bool bVar1;
  __type _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  GLShaderTexture *t;
  iterator __end2;
  iterator __begin2;
  vector<polyscope::render::backend_openGL_mock::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderTexture>_>
  *__range2;
  value_type *in_stack_ffffffffffffff08;
  __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderTexture_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderTexture>_>_>
  *in_stack_ffffffffffffff10;
  GLShaderTexture *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  string local_c8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  string *in_stack_ffffffffffffff70;
  string local_70 [32];
  string local_50 [32];
  reference local_30;
  GLShaderTexture *local_28;
  __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderTexture_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderTexture>_>_>
  local_20;
  undefined1 *local_18;
  
  local_18 = (undefined1 *)((long)&in_RDI[1].field_2 + 8);
  local_20._M_current =
       (GLShaderTexture *)
       std::
       vector<polyscope::render::backend_openGL_mock::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderTexture>_>
       ::begin((vector<polyscope::render::backend_openGL_mock::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderTexture>_>
                *)in_stack_ffffffffffffff08);
  local_28 = (GLShaderTexture *)
             std::
             vector<polyscope::render::backend_openGL_mock::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderTexture>_>
             ::end((vector<polyscope::render::backend_openGL_mock::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderTexture>_>
                    *)in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff10,
                       (__normal_iterator<polyscope::render::backend_openGL_mock::GLShaderTexture_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderTexture>_>_>
                        *)in_stack_ffffffffffffff08);
    if (!bVar1) {
      this_00 = (GLShaderTexture *)((long)&in_RDI[1].field_2 + 8);
      std::__cxx11::string::string(local_c8,(string *)in_RSI);
      std::shared_ptr<polyscope::render::backend_openGL_mock::GLTextureBuffer>::shared_ptr
                ((shared_ptr<polyscope::render::backend_openGL_mock::GLTextureBuffer> *)this_00,
                 in_stack_ffffffffffffff08);
      std::
      vector<polyscope::render::backend_openGL_mock::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderTexture>_>
      ::push_back((vector<polyscope::render::backend_openGL_mock::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderTexture>_>
                   *)this_00,in_stack_ffffffffffffff08);
      GLShaderTexture::~GLShaderTexture(this_00);
      return;
    }
    local_30 = __gnu_cxx::
               __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderTexture_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderTexture>_>_>
               ::operator*(&local_20);
    _Var2 = std::operator==(in_RDI,in_RSI);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderTexture_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderTexture>_>_>
    ::operator++(&local_20);
  }
  if (local_30->dim == *(int *)(in_RSI + 1)) {
    return;
  }
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 in_stack_ffffffffffffff50);
  std::operator+(in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10);
  exception(in_stack_ffffffffffffff70);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void GLCompiledProgram::addUniqueTexture(ShaderSpecTexture newTexture) {
  for (GLShaderTexture& t : textures) {
    if (t.name == newTexture.name) {

      // if it occurs twice, confirm that the occurences match
      if (t.dim != newTexture.dim)
        exception("texture " + t.name + " appears twice in program with different dimensions");

      return;
    }
  }
  textures.push_back(GLShaderTexture{newTexture.name, newTexture.dim, 777, false, nullptr, nullptr});
}